

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O0

void __thiscall
imrt::ACO::initializeHeuristic
          (ACO *this,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,
          vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int max_intensity,
          int initial_intensity,int step_intensity)

{
  pair<int,_int> p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  double *pdVar5;
  mapped_type *pmVar6;
  void *pvVar7;
  ostream *poVar8;
  Plan *this_00;
  long in_RDI;
  undefined4 in_R9D;
  double dVar9;
  int in_stack_00000010;
  int j_1;
  int a_1;
  int s_1;
  Plan *p;
  int i_1;
  double deposit;
  int aux;
  Station *st;
  int r;
  int j;
  int i;
  int a;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  mheuristic;
  int s;
  int nls;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 uVar10;
  int in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffde4;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  int iVar12;
  uint in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 uVar14;
  int in_stack_fffffffffffffe04;
  Matrix *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined2 uVar15;
  key_type_conflict *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe28;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  int local_128;
  int local_124;
  int local_120;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_stack_ffffffffffffff20;
  Collimator *in_stack_ffffffffffffff28;
  Plan *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int local_a8;
  int local_a4;
  int in_stack_ffffffffffffff70;
  int local_8c;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  int local_34;
  
  local_34 = 0;
  while( true ) {
    iVar1 = Collimator::getNbAngles(*(Collimator **)(in_RDI + 0xf8));
    iVar2 = (int)in_stack_fffffffffffffe48;
    iVar12 = (int)in_stack_fffffffffffffe40;
    uVar15 = (undefined2)((ulong)in_stack_fffffffffffffe10 >> 0x30);
    if (iVar1 <= local_34) break;
    std::
    map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>::
    map((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
         *)0x13f4b3);
    Collimator::getIntensityLevelSize((Collimator *)0x13f4e6);
    maths::Matrix::Matrix
              ((Matrix *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::push_back
              ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (value_type *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    maths::Matrix::~Matrix((Matrix *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    for (in_stack_ffffffffffffff78 = 0; in_stack_ffffffffffffff78 < *(int *)(in_RDI + 0x100);
        in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 1) {
      local_8c = 0;
      while( true ) {
        iVar1 = Collimator::getIntensityLevelSize((Collimator *)0x13f583);
        if (iVar1 <= local_8c) break;
        pvVar4 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0x88)
                            ,(long)local_34);
        pdVar5 = maths::Matrix::operator()(pvVar4,in_stack_ffffffffffffff78,local_8c);
        *pdVar5 = 0.5;
        local_8c = local_8c + 1;
      }
      Collimator::getXdim(*(Collimator **)(in_RDI + 0xf8));
      Collimator::getReferenceSize(*(Collimator **)(in_RDI + 0xf8));
      maths::Matrix::Matrix
                ((Matrix *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
      std::
      map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe18);
      maths::Matrix::operator=
                (in_stack_fffffffffffffe08,
                 (Matrix *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      maths::Matrix::~Matrix
                ((Matrix *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      local_a4 = 0;
      while( true ) {
        iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xf8));
        if (iVar1 <= local_a4) break;
        local_a8 = 0;
        while( true ) {
          iVar1 = Collimator::getReferenceSize(*(Collimator **)(in_RDI + 0xf8));
          if (iVar1 <= local_a8) break;
          pmVar6 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                                in_stack_fffffffffffffe18);
          pdVar5 = maths::Matrix::operator()(pmVar6,local_a4,local_a8);
          *pdVar5 = 0.5;
          local_a8 = local_a8 + 1;
        }
        local_a4 = local_a4 + 1;
      }
    }
    std::
    vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
    ::push_back((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                (value_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    std::
    map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>::
    ~map((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
          *)0x13f862);
    local_34 = local_34 + 1;
  }
  pvVar7 = operator_new(0x78);
  ApertureILS::ApertureILS
            ((ApertureILS *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18,
             SUB21((ushort)uVar15 >> 8,0),SUB21(uVar15,0),(double)in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe04,
             (double)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             (double)((ulong)in_stack_fffffffffffffdf4 << 0x20),
             SUB41((uint)in_stack_fffffffffffffdec >> 0x18,0),in_stack_fffffffffffffe38,iVar12,iVar2
            );
  *(void **)(in_RDI + 0x10) = pvVar7;
  poVar8 = std::operator<<((ostream *)&std::cout,"Initializing heuristic information with ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,5);
  poVar8 = std::operator<<(poVar8," ls executions");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  for (iVar1 = 0; iVar1 < 5; iVar1 = iVar1 + 1) {
    this_00 = (Plan *)operator_new(0xd0);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    uVar10 = *(undefined4 *)(in_RDI + 0x100);
    uVar14 = 0;
    uVar13 = 0xffffffff;
    uVar11 = in_R9D;
    iVar12 = in_stack_00000010;
    Plan::Plan((Plan *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40,
               (vector<double,_std::allocator<double>_> *)CONCAT44(iVar1,in_stack_ffffffffffffff38),
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdf4,iVar12)
              );
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdf4,iVar12)
              );
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdf4,iVar12)
              );
    ApertureILS::simpleLocalSearch
              ((ApertureILS *)CONCAT44(in_stack_fffffffffffffe04,uVar14),
               (Plan *)CONCAT44(in_stack_fffffffffffffdfc,uVar13),
               SUB41(in_stack_fffffffffffffdf4 >> 0x18,0));
    poVar8 = std::operator<<((ostream *)&std::cout," Local search ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar1);
    poVar8 = std::operator<<(poVar8,": ");
    dVar9 = Plan::getEvaluation(this_00);
    pvVar7 = (void *)std::ostream::operator<<(poVar8,dVar9);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    dVar9 = Plan::getEvaluation(this_00);
    in_stack_ffffffffffffff40 = (vector<double,_std::allocator<double>_> *)(5.0 / dVar9);
    local_120 = 0;
    while( true ) {
      iVar2 = Collimator::getNbAngles(*(Collimator **)(in_RDI + 0xf8));
      if (iVar2 <= local_120) break;
      Plan::get_station((Plan *)CONCAT44(in_stack_fffffffffffffde4,uVar11),in_stack_fffffffffffffddc
                       );
      for (local_124 = 0; local_124 < *(int *)(in_RDI + 0x100); local_124 = local_124 + 1) {
        in_stack_fffffffffffffe28 = *(vector<double,_std::allocator<double>_> **)(in_RDI + 0xf8);
        Station::getApertureIntensity
                  ((Station *)CONCAT44(in_stack_fffffffffffffde4,uVar11),in_stack_fffffffffffffddc);
        in_stack_ffffffffffffff4c =
             Collimator::getIntensityLevel
                       ((Collimator *)CONCAT44(in_stack_fffffffffffffde4,uVar11),
                        (double)CONCAT44(in_stack_fffffffffffffddc,uVar10));
        pvVar4 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0x88)
                            ,(long)local_120);
        pdVar5 = maths::Matrix::operator()(pvVar4,local_124,in_stack_ffffffffffffff4c);
        in_stack_fffffffffffffe30 =
             (vector<double,_std::allocator<double>_> *)
             (*pdVar5 + (double)in_stack_ffffffffffffff40);
        pvVar4 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0x88)
                            ,(long)local_120);
        pdVar5 = maths::Matrix::operator()(pvVar4,local_124,in_stack_ffffffffffffff4c);
        *pdVar5 = (double)in_stack_fffffffffffffe30;
        local_128 = 0;
        while( true ) {
          iVar2 = local_128;
          iVar3 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xf8));
          if (iVar3 <= iVar2) break;
          Station::getApertureShape
                    ((Station *)CONCAT44(in_stack_fffffffffffffddc,uVar10),0,0x13fcae);
          p_00.second = iVar12;
          p_00.first = in_stack_fffffffffffffdec;
          in_stack_ffffffffffffff4c =
               Collimator::searchReferenceIndex
                         ((Collimator *)CONCAT44(in_stack_fffffffffffffde4,uVar11),p_00);
          std::
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                        *)(in_RDI + 0x40),(long)local_120);
          pmVar6 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                 *)CONCAT44(iVar2,in_stack_fffffffffffffe20),
                                in_stack_fffffffffffffe18);
          pdVar5 = maths::Matrix::operator()(pmVar6,local_128,in_stack_ffffffffffffff4c);
          in_stack_fffffffffffffe18 =
               (key_type_conflict *)(*pdVar5 + (double)in_stack_ffffffffffffff40);
          std::
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                        *)(in_RDI + 0x40),(long)local_120);
          pmVar6 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                 *)CONCAT44(iVar2,in_stack_fffffffffffffe20),
                                in_stack_fffffffffffffe18);
          pdVar5 = maths::Matrix::operator()(pmVar6,local_128,in_stack_ffffffffffffff4c);
          *pdVar5 = (double)in_stack_fffffffffffffe18;
          local_128 = local_128 + 1;
        }
      }
      local_120 = local_120 + 1;
    }
    in_stack_ffffffffffffff30 = this_00;
  }
  return;
}

Assistant:

void initializeHeuristic (vector<double> w, vector<double> Zmin, vector<double> Zmax, vector<Volume>& volumes, 
                            int max_intensity, int initial_intensity, int step_intensity) {
    int nls=5;
    //Initialize structure
    for (int s=0; s< collimator.getNbAngles();s++) {
      map<int, Matrix> mheuristic;
      iheuristic.push_back(Matrix(max_apertures,  collimator.getIntensityLevelSize()));
      for (int a=0; a< max_apertures; a++) {
        for (int i=0; i< collimator.getIntensityLevelSize(); i++){
          iheuristic[s](a,i) = 0.5;
        }
        mheuristic[a] = Matrix(collimator.getXdim(), collimator.getReferenceSize());
        for (int j = 0; j < collimator.getXdim(); j++) {
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            mheuristic[a](j,r) =0.5;
          }
        }
      }
      heuristic.push_back(mheuristic);
    }
    
    //Perform local search and generate heuristic information
    Station *st;
    int aux;
    double deposit;
    ils = new ApertureILS(1, 1, true, true, 1, step_intensity, 100, 0.5, false, 0, ILS::ACCEPT_NONE, ApertureILS::FIRST_IMPROVEMENT);
    cout << "Initializing heuristic information with " << nls << " ls executions"<< endl;
    for (int i=0 ;i < nls; i++) {
      Plan *p = new Plan(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, -1, Station::OPEN_MIN_SETUP);
      ils->simpleLocalSearch (*p, false);
      cout << " Local search "<<i<<": "<< p->getEvaluation() << endl;
      
      // Place deposit in heuristic information
      deposit = 5.0/p->getEvaluation();
      for (int s = 0; s < collimator.getNbAngles(); s++) {
        st = p->get_station(s);
        for (int a = 0; a < max_apertures; a++) {
          // Intensity heuristic 
          aux = collimator.getIntensityLevel(st->getApertureIntensity(a));
          iheuristic[s](a,aux) = iheuristic[s](a,aux) + deposit;
          // Aperture heuristic
          for (int j = 0; j < collimator.getXdim(); j++) {
            aux = collimator.searchReferenceIndex(st->getApertureShape(a, j));
            heuristic[s][a](j,aux) = heuristic[s][a](j,aux) + deposit;
          }
        }
      }
    }
  }